

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O2

Aig_Man_t * Saig_Synchronize(Aig_Man_t *pAig1,Aig_Man_t *pAig2,int nWords,int fVerbose)

{
  int nEntries;
  int iVar1;
  abctime aVar2;
  Vec_Str_t *vSequence;
  abctime aVar3;
  Vec_Str_t *vSequence_00;
  Vec_Ptr_t *vSimInfo;
  Aig_Man_t *p0;
  Aig_Man_t *p1;
  Aig_Man_t *p;
  
  if (fVerbose != 0) {
    printf("Design 1: ");
    Aig_ManPrintStats(pAig1);
    printf("Design 2: ");
    Aig_ManPrintStats(pAig2);
  }
  aVar2 = Abc_Clock();
  vSequence = Saig_SynchSequence(pAig1,nWords);
  if (vSequence == (Vec_Str_t *)0x0) {
    iVar1 = 0x7eed57;
    printf("Design 1: Synchronizing sequence is not found. ");
    if (fVerbose == 0) goto LAB_005508a6;
LAB_0055086c:
    Abc_Print(iVar1,"%s =","Time");
    aVar3 = Abc_Clock();
    Abc_Print(iVar1,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
  }
  else {
    if (fVerbose != 0) {
      iVar1 = 0x7eed87;
      printf("Design 1: Synchronizing sequence of length %4d is found. ",
             (long)vSequence->nSize / (long)pAig1->nTruePis & 0xffffffff,
             (long)vSequence->nSize % (long)pAig1->nTruePis & 0xffffffff);
      goto LAB_0055086c;
    }
LAB_005508a6:
    putchar(10);
  }
  aVar2 = Abc_Clock();
  vSequence_00 = Saig_SynchSequence(pAig2,nWords);
  if (vSequence_00 == (Vec_Str_t *)0x0) {
    iVar1 = 0x7eee11;
    printf("Design 2: Synchronizing sequence is not found. ");
    if (fVerbose == 0) goto LAB_00550935;
  }
  else {
    if (fVerbose == 0) {
LAB_00550935:
      putchar(10);
      goto LAB_0055093d;
    }
    iVar1 = 0x7eee41;
    printf("Design 2: Synchronizing sequence of length %4d is found. ",
           (long)vSequence_00->nSize / (long)pAig2->nTruePis & 0xffffffff,
           (long)vSequence_00->nSize % (long)pAig2->nTruePis & 0xffffffff);
  }
  Abc_Print(iVar1,"%s =","Time");
  aVar3 = Abc_Clock();
  Abc_Print(iVar1,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
LAB_0055093d:
  if (vSequence == (Vec_Str_t *)0x0 || vSequence_00 == (Vec_Str_t *)0x0) {
    puts("Quitting synchronization.");
    if (vSequence != (Vec_Str_t *)0x0) {
      Vec_StrFree(vSequence);
    }
    if (vSequence_00 != (Vec_Str_t *)0x0) {
      Vec_StrFree(vSequence_00);
    }
    p = (Aig_Man_t *)0x0;
  }
  else {
    aVar2 = Abc_Clock();
    iVar1 = pAig1->vObjs->nSize;
    nEntries = pAig2->vObjs->nSize;
    if (nEntries < iVar1) {
      nEntries = iVar1;
    }
    vSimInfo = Vec_PtrAllocSimInfo(nEntries,1);
    iVar1 = Saig_SynchSequenceRun(pAig1,vSimInfo,vSequence,1);
    if (iVar1 != 0) {
      __assert_fail("RetValue == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSynch.c"
                    ,0x274,"Aig_Man_t *Saig_Synchronize(Aig_Man_t *, Aig_Man_t *, int, int)");
    }
    iVar1 = Saig_SynchSequenceRun(pAig1,vSimInfo,vSequence_00,0);
    if (iVar1 != 0) {
      __assert_fail("RetValue == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSynch.c"
                    ,0x276,"Aig_Man_t *Saig_Synchronize(Aig_Man_t *, Aig_Man_t *, int, int)");
    }
    iVar1 = Saig_SynchSequenceRun(pAig2,vSimInfo,vSequence_00,1);
    if (iVar1 != 0) {
      __assert_fail("RetValue == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSynch.c"
                    ,0x27a,"Aig_Man_t *Saig_Synchronize(Aig_Man_t *, Aig_Man_t *, int, int)");
    }
    p0 = Saig_ManDupInitZero(pAig1);
    p1 = Saig_ManDupInitZero(pAig2);
    p = Saig_ManCreateMiter(p0,p1,0);
    Aig_ManCleanup(p);
    Aig_ManStop(p0);
    Aig_ManStop(p1);
    Vec_PtrFree(vSimInfo);
    Vec_StrFree(vSequence);
    Vec_StrFree(vSequence_00);
    Aig_ManCleanMarkA(pAig1);
    Aig_ManCleanMarkA(pAig2);
    if (fVerbose != 0) {
      iVar1 = 0x7eeebb;
      printf("Miter of the synchronized designs is constructed.         ");
      Abc_Print(iVar1,"%s =","Time");
      aVar3 = Abc_Clock();
      Abc_Print(iVar1,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
    }
  }
  return p;
}

Assistant:

Aig_Man_t * Saig_Synchronize( Aig_Man_t * pAig1, Aig_Man_t * pAig2, int nWords, int fVerbose )
{
    Aig_Man_t * pAig1z, * pAig2z, * pMiter;
    Vec_Str_t * vSeq1, * vSeq2;
    Vec_Ptr_t * vSimInfo;
    int RetValue;
    abctime clk;
/*
    {
        unsigned u = Saig_SynchRandomTernary();
        unsigned w = Saig_SynchRandomTernary();
        unsigned x = Saig_SynchNot( u );
        unsigned y = Saig_SynchNot( w );
        unsigned z = Saig_SynchAnd( x, y );

        Extra_PrintBinary( stdout, &u, 32 );  printf( "\n" );
        Extra_PrintBinary( stdout, &w, 32 );  printf( "\n" );  printf( "\n" );
        Extra_PrintBinary( stdout, &x, 32 );  printf( "\n" );
        Extra_PrintBinary( stdout, &y, 32 );  printf( "\n" );  printf( "\n" );
        Extra_PrintBinary( stdout, &z, 32 );  printf( "\n" );
    }
*/
    // report statistics
    if ( fVerbose )
    {
        printf( "Design 1: " );
        Aig_ManPrintStats( pAig1 );
        printf( "Design 2: " );
        Aig_ManPrintStats( pAig2 );
    }

    // synchronize the first design
    clk = Abc_Clock();
    vSeq1 = Saig_SynchSequence( pAig1, nWords );
    if ( vSeq1 == NULL )
        printf( "Design 1: Synchronizing sequence is not found. " );
    else if ( fVerbose )
        printf( "Design 1: Synchronizing sequence of length %4d is found. ", Vec_StrSize(vSeq1) / Saig_ManPiNum(pAig1) );
    if ( fVerbose )
    {
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    else
        printf( "\n" );

    // synchronize the first design
    clk = Abc_Clock();
    vSeq2 = Saig_SynchSequence( pAig2, nWords );
    if ( vSeq2 == NULL )
        printf( "Design 2: Synchronizing sequence is not found. " );
    else if ( fVerbose )
        printf( "Design 2: Synchronizing sequence of length %4d is found. ", Vec_StrSize(vSeq2) / Saig_ManPiNum(pAig2) );
    if ( fVerbose )
    {
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    else
        printf( "\n" );

    // quit if one of the designs cannot be synchronized
    if ( vSeq1 == NULL || vSeq2 == NULL )
    {
        printf( "Quitting synchronization.\n" );
        if ( vSeq1 ) Vec_StrFree( vSeq1 );
        if ( vSeq2 ) Vec_StrFree( vSeq2 );
        return NULL;
    }
    clk = Abc_Clock();
    vSimInfo = Vec_PtrAllocSimInfo( Abc_MaxInt( Aig_ManObjNumMax(pAig1), Aig_ManObjNumMax(pAig2) ), 1 );

    // process Design 1
    RetValue = Saig_SynchSequenceRun( pAig1, vSimInfo, vSeq1, 1 );
    assert( RetValue == 0 );
    RetValue = Saig_SynchSequenceRun( pAig1, vSimInfo, vSeq2, 0 );
    assert( RetValue == 0 );

    // process Design 2
    RetValue = Saig_SynchSequenceRun( pAig2, vSimInfo, vSeq2, 1 );
    assert( RetValue == 0 );

    // duplicate designs
    pAig1z = Saig_ManDupInitZero( pAig1 );
    pAig2z = Saig_ManDupInitZero( pAig2 );
    pMiter = Saig_ManCreateMiter( pAig1z, pAig2z, 0 );
    Aig_ManCleanup( pMiter );
    Aig_ManStop( pAig1z );
    Aig_ManStop( pAig2z );

    // cleanup
    Vec_PtrFree( vSimInfo );
    Vec_StrFree( vSeq1 );
    Vec_StrFree( vSeq2 );
    Aig_ManCleanMarkA( pAig1 );
    Aig_ManCleanMarkA( pAig2 );

    if ( fVerbose )
    {
        printf( "Miter of the synchronized designs is constructed.         " );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    return pMiter;
}